

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsd.cpp
# Opt level: O1

image_char new_image_char_ini(uint xsize,uint ysize,uchar fill_value)

{
  int *piVar1;
  image_char piVar2;
  image_char extraout_RAX;
  uchar *puVar3;
  image_int piVar4;
  int extraout_EDX;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint xsize_00;
  undefined4 in_register_0000003c;
  uchar *__ptr;
  
  puVar3 = (uchar *)CONCAT44(in_register_0000003c,xsize);
  uVar5 = ysize;
  piVar2 = new_image_char(xsize,ysize);
  if ((piVar2 != (image_char)0x0) && (puVar3 = piVar2->data, puVar3 != (uchar *)0x0)) {
    if (ysize * xsize != 0) {
      memset(puVar3,(uint)fill_value,(ulong)(ysize * xsize));
    }
    return piVar2;
  }
  new_image_char_ini();
  __ptr = puVar3;
  if ((puVar3 != (uchar *)0x0) && (__ptr = *(uchar **)puVar3, __ptr != (uchar *)0x0)) {
    free(__ptr);
    free(puVar3);
    return extraout_RAX;
  }
  uVar8 = (uint)__ptr;
  free_image_int();
  uVar6 = uVar5;
  if ((uVar8 == 0) || (uVar5 == 0)) {
    xsize_00 = uVar8;
    new_image_int();
  }
  else {
    xsize_00 = 0x10;
    piVar2 = (image_char)malloc(0x10);
    if (piVar2 != (image_char)0x0) {
      xsize_00 = uVar5 * uVar8;
      uVar6 = 4;
      puVar3 = (uchar *)calloc((ulong)xsize_00,4);
      piVar2->data = puVar3;
      if (puVar3 != (uchar *)0x0) {
        piVar2->xsize = uVar8;
        piVar2->ysize = uVar5;
        return piVar2;
      }
      goto LAB_001042fd;
    }
  }
  new_image_int();
LAB_001042fd:
  new_image_int();
  piVar4 = new_image_int(xsize_00,uVar6);
  if (uVar6 * xsize_00 != 0) {
    piVar1 = piVar4->data;
    uVar7 = 0;
    do {
      piVar1[uVar7] = extraout_EDX;
      uVar7 = uVar7 + 1;
    } while (uVar6 * xsize_00 != uVar7);
  }
  return (image_char)piVar4;
}

Assistant:

image_char new_image_char_ini( unsigned int xsize, unsigned int ysize,
                               unsigned char fill_value )
{
    image_char image = new_image_char(xsize, ysize); /* create image */
    unsigned int N = xsize * ysize;
    unsigned int i;

    /* check parameters */
    if ( image == NULL || image->data == NULL )
        error("new_image_char_ini: invalid image.");

    /* initialize */
    for (i = 0; i < N; i++) image->data[i] = fill_value;

    return image;
}